

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.cpp
# Opt level: O2

int gf256_init_(int version)

{
  uint8_t uVar1;
  ushort uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint i;
  long lVar7;
  uint8_t *puVar8;
  byte bVar9;
  byte bVar10;
  int x;
  ulong uVar11;
  long lVar12;
  uint8_t *puVar13;
  long lVar14;
  int iVar15;
  byte bVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  int local_2c;
  
  if (version == 2) {
    iVar15 = 0;
    if (Initialized == '\0') {
      Initialized = '\x01';
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        *(uchar *)((long)&local_2c + lVar7) = "\x04\x03\x02\x01"[lVar7];
      }
      if (local_2c == 0x1020304) {
        lVar7 = cpuid_Version_info(1);
        lVar17 = 0;
        CpuHasSSSE3 = (bool)((byte)(*(uint *)(lVar7 + 0xc) >> 9) & 1);
        lVar7 = cpuid_Extended_Feature_Enumeration_info(7);
        bVar16 = (byte)*(undefined4 *)(lVar7 + 4) >> 5;
        bVar9 = 1;
        CpuHasAVX2 = (bool)(bVar16 & 1);
        GF256Ctx.Polynomial = 0x14d;
        GF256Ctx.GF256_LOG_TABLE[0] = 0x200;
        GF256Ctx.GF256_EXP_TABLE[0] = '\x01';
        while (lVar17 != 0xfe) {
          bVar10 = 0;
          if ((char)bVar9 < '\0') {
            bVar10 = 0x4d;
          }
          bVar9 = bVar10 ^ bVar9 * '\x02';
          GF256Ctx.GF256_EXP_TABLE[lVar17 + 1] = bVar9;
          lVar17 = lVar17 + 1;
          GF256Ctx.GF256_LOG_TABLE[bVar9] = (uint16_t)lVar17;
        }
        GF256Ctx.GF256_EXP_TABLE[0xff] = '\x01';
        GF256Ctx.GF256_LOG_TABLE[1] = 0xff;
        for (lVar7 = -0xfe; lVar7 != 0; lVar7 = lVar7 + 1) {
          GF256Ctx.GF256_EXP_TABLE[lVar7 + 0x1fe] = GF256Ctx.GF256_EXP_TABLE[lVar7 + 0xff];
        }
        GF256Ctx.GF256_EXP_TABLE[0x1fe] = '\x01';
        for (lVar7 = 0; lVar7 != 0x1fd; lVar7 = lVar7 + 1) {
          GF256Ctx.GF256_EXP_TABLE[lVar7 + 0x1ff] = '\0';
        }
        for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
          GF256Ctx.GF256_DIV_TABLE[lVar7] = '\0';
          GF256Ctx.GF256_MUL_TABLE[lVar7] = '\0';
        }
        lVar7 = 0x1deee0;
        lVar17 = 0x1eeee0;
        lVar12 = 0x1eefe1;
        for (lVar18 = 1; lVar18 != 0x100; lVar18 = lVar18 + 1) {
          bVar9 = (byte)GF256Ctx.GF256_LOG_TABLE[lVar18];
          *(undefined1 *)(lVar7 + 0x100) = 0;
          *(undefined1 *)(lVar17 + 0x100) = 0;
          lVar7 = lVar7 + 0x100;
          lVar17 = lVar17 + 0x100;
          for (lVar14 = 0; lVar14 != 0xff; lVar14 = lVar14 + 1) {
            uVar2 = GF256Ctx.GF256_LOG_TABLE[lVar14 + 1];
            *(uint8_t *)(lVar12 + -0x10000 + lVar14) =
                 GF256Ctx.GF256_EXP_TABLE[(ulong)uVar2 + (ulong)bVar9];
            *(uint8_t *)(lVar12 + lVar14) =
                 GF256Ctx.GF256_EXP_TABLE[(ulong)uVar2 + (ulong)(bVar9 ^ 0xff)];
          }
          lVar12 = lVar12 + 0x100;
        }
        puVar8 = GF256Ctx.GF256_INV_TABLE;
        for (lVar7 = -0x10000; lVar7 != 0; lVar7 = lVar7 + 0x100) {
          *puVar8 = GF256Ctx.GF256_INV_TABLE[lVar7 + 1];
          puVar8 = puVar8 + 1;
        }
        puVar8 = GF256Ctx.GF256_SQR_TABLE;
        for (lVar7 = -0x10100; lVar7 != 0; lVar7 = lVar7 + 0x101) {
          *puVar8 = GF256Ctx.GF256_DIV_TABLE[lVar7 + 0x100];
          puVar8 = puVar8 + 1;
        }
        puVar8 = GF256Ctx.GF256_MUL_TABLE;
        for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
          puVar13 = puVar8;
          for (lVar17 = 0; uVar6 = m_SelfTestBuffers.B._8_8_, uVar5 = m_SelfTestBuffers.B._0_8_,
              uVar4 = m_SelfTestBuffers.A._8_8_, uVar3 = m_SelfTestBuffers.A._0_8_, lVar17 != 0x10;
              lVar17 = lVar17 + 1) {
            uVar1 = *puVar13;
            puVar13 = puVar13 + 0x10;
            m_SelfTestBuffers.A[lVar17] = puVar8[lVar17];
            m_SelfTestBuffers.B[lVar17] = uVar1;
          }
          GF256Ctx.MM128.TABLE_LO_Y[lVar7][0] = m_SelfTestBuffers.A._0_8_;
          GF256Ctx.MM128.TABLE_LO_Y[lVar7][1] = uVar4;
          GF256Ctx.MM128.TABLE_HI_Y[lVar7][0] = uVar5;
          GF256Ctx.MM128.TABLE_HI_Y[lVar7][1] = uVar6;
          if ((bVar16 & 1) != 0) {
            GF256Ctx.MM256.TABLE_LO_Y[lVar7][2] = uVar3;
            GF256Ctx.MM256.TABLE_LO_Y[lVar7][3] = uVar4;
            GF256Ctx.MM256.TABLE_LO_Y[lVar7][0] = uVar3;
            GF256Ctx.MM256.TABLE_LO_Y[lVar7][1] = uVar4;
            GF256Ctx.MM256.TABLE_HI_Y[lVar7][0] = uVar5;
            GF256Ctx.MM256.TABLE_HI_Y[lVar7][1] = uVar6;
            GF256Ctx.MM256.TABLE_HI_Y[lVar7][2] = uVar5;
            GF256Ctx.MM256.TABLE_HI_Y[lVar7][3] = uVar6;
          }
          puVar8 = puVar8 + 0x100;
        }
        lVar7 = 0x1deee0;
        iVar15 = -3;
        for (uVar11 = 0; uVar11 != 0x100; uVar11 = uVar11 + 1) {
          uVar19 = 0;
          lVar17 = 0;
          while (lVar17 != 0x10000) {
            uVar20 = (ulong)*(byte *)(lVar7 + lVar17);
            if (lVar17 == 0 || uVar11 == 0) {
              if (uVar20 != 0) {
                return -3;
              }
              uVar20 = 0;
            }
            else {
              if (uVar19 != GF256Ctx.GF256_DIV_TABLE[uVar11 << 8 | uVar20]) {
                return -3;
              }
              if (uVar11 != *(byte *)(lVar17 + uVar20 + 0x1eeee0)) {
                return -3;
              }
            }
            uVar19 = uVar19 + 1;
            lVar12 = lVar17 + 0x100;
            bVar21 = lVar17 == 0x100;
            lVar17 = lVar12;
            if ((bVar21) && (uVar11 != uVar20)) {
              return -3;
            }
          }
          lVar7 = lVar7 + 1;
        }
        m_SelfTestBuffers.A[0x3f] = 'Z';
        m_SelfTestBuffers.B[0x3f] = 'Z';
        m_SelfTestBuffers.C[0x3f] = 'Z';
        for (lVar7 = -0x3f; lVar7 != 0; lVar7 = lVar7 + 1) {
          m_SelfTestBuffers.A[lVar7 + 0x3f] = '\x1f';
          m_SelfTestBuffers.B[lVar7 + 0x3f] = 0xf7;
        }
        gf256_add_mem(&m_SelfTestBuffers,m_SelfTestBuffers.B,0x3f);
        lVar7 = 0;
        while (lVar7 != 0x3f) {
          puVar8 = m_SelfTestBuffers.A + lVar7;
          lVar7 = lVar7 + 1;
          if (*puVar8 != 0xe8) {
            return -3;
          }
        }
        for (lVar7 = -0x3f; lVar7 != 0; lVar7 = lVar7 + 1) {
          m_SelfTestBuffers.A[lVar7 + 0x3f] = '\x1f';
          m_SelfTestBuffers.B[lVar7 + 0x3f] = 0xf7;
          m_SelfTestBuffers.C[lVar7 + 0x3f] = 'q';
        }
        gf256_add2_mem(&m_SelfTestBuffers,m_SelfTestBuffers.B,m_SelfTestBuffers.C,0x3f);
        lVar7 = 0;
        while (lVar7 != 0x3f) {
          puVar8 = m_SelfTestBuffers.A + lVar7;
          lVar7 = lVar7 + 1;
          if (*puVar8 != 0x99) {
            return -3;
          }
        }
        for (lVar7 = -0x3f; lVar7 != 0; lVar7 = lVar7 + 1) {
          m_SelfTestBuffers.A[lVar7 + 0x3f] = 'U';
          m_SelfTestBuffers.B[lVar7 + 0x3f] = 0xaa;
          m_SelfTestBuffers.C[lVar7 + 0x3f] = 'l';
        }
        gf256_addset_mem(&m_SelfTestBuffers,m_SelfTestBuffers.B,m_SelfTestBuffers.C,0x3f);
        lVar7 = 0;
        do {
          if (lVar7 == 0x3f) {
            for (lVar7 = -0x3f; uVar1 = GF256Ctx.GF256_MUL_TABLE[0x6caa], lVar7 != 0;
                lVar7 = lVar7 + 1) {
              m_SelfTestBuffers.A[lVar7 + 0x3f] = 0xff;
              m_SelfTestBuffers.B[lVar7 + 0x3f] = 0xaa;
            }
            gf256_muladd_mem(&m_SelfTestBuffers,'l',m_SelfTestBuffers.B,0x3f);
            lVar7 = 0;
            while (lVar7 != 0x3f) {
              puVar8 = m_SelfTestBuffers.A + lVar7;
              lVar7 = lVar7 + 1;
              if ((*puVar8 ^ uVar1) != 0xff) {
                return -3;
              }
            }
            for (lVar7 = -0x3f; uVar1 = GF256Ctx.GF256_MUL_TABLE[0x55a2], lVar7 != 0;
                lVar7 = lVar7 + 1) {
              m_SelfTestBuffers.A[lVar7 + 0x3f] = 0xff;
              m_SelfTestBuffers.B[lVar7 + 0x3f] = 'U';
            }
            gf256_mul_mem(&m_SelfTestBuffers,m_SelfTestBuffers.B,0xa2,0x3f);
            lVar7 = 0;
            while (lVar7 != 0x3f) {
              puVar8 = m_SelfTestBuffers.A + lVar7;
              lVar7 = lVar7 + 1;
              if (*puVar8 != uVar1) {
                return -3;
              }
            }
            if (m_SelfTestBuffers.A[0x3f] != 'Z') {
              return -3;
            }
            if (m_SelfTestBuffers.B[0x3f] != 'Z') {
              return -3;
            }
            return (uint)(m_SelfTestBuffers.C[0x3f] == 'Z') * 3 + -3;
          }
          puVar8 = m_SelfTestBuffers.A + lVar7;
          lVar7 = lVar7 + 1;
        } while (*puVar8 == 0xc6);
      }
      else {
        iVar15 = -2;
      }
    }
  }
  else {
    iVar15 = -1;
  }
  return iVar15;
}

Assistant:

int gf256_init_(int version)
{
    if (version != GF256_VERSION)
        return -1; // User's header does not match library version.

    // Avoid multiple initialization
    if (Initialized)
        return 0;
    Initialized = true;

    if (!IsExpectedEndian())
        return -2; // Unexpected byte order.

    gf256_architecture_init();
    gf256_poly_init(kDefaultPolynomialIndex);
    gf256_explog_init();
    gf256_muldiv_init();
    gf256_inv_init();
    gf256_sqr_init();
    gf256_mul_mem_init();

    if (!gf256_self_test())
        return -3; // Self-test failed (perhaps untested configuration)

    return 0;
}